

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* utils::cfg_parsing(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *__return_storage_ptr__,string *cfg_filename)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  allocator<char> local_601;
  double local_600;
  string value;
  string x_value1;
  string line;
  string x_value2;
  string key;
  key_type local_558;
  istringstream linestream;
  istringstream valuestream;
  ifstream filestream;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  line.field_2._M_local_buf[0] = '\0';
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  key.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&filestream,(string *)cfg_filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&filestream,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      linestream = (istringstream)0x3d;
      valuestream = (istringstream)0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )line._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(line._M_dataplus._M_p + line._M_string_length),(char *)&linestream,
                 (char *)&valuestream);
      std::__cxx11::istringstream::istringstream((istringstream *)&linestream,(string *)&line,_S_in)
      ;
      while( true ) {
        piVar3 = std::operator>>((istream *)&linestream,(string *)&key);
        piVar3 = std::operator>>(piVar3,(string *)&value);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        bVar2 = std::operator==(&key,"x0");
        if (bVar2) {
          valuestream = (istringstream)0x2c;
          x_value1._M_dataplus._M_p._0_1_ = 0x20;
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )value._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(value._M_dataplus._M_p + value._M_string_length),(char *)&valuestream,
                     (char *)&x_value1);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&valuestream,(string *)&value,_S_in);
          x_value1._M_dataplus._M_p = (pointer)&x_value1.field_2;
          x_value1._M_string_length = 0;
          x_value1.field_2._M_local_buf[0] = '\0';
          x_value2._M_dataplus._M_p = (pointer)&x_value2.field_2;
          x_value2._M_string_length = 0;
          x_value2.field_2._M_local_buf[0] = '\0';
          while( true ) {
            piVar3 = std::operator>>((istream *)&valuestream,(string *)&x_value1);
            piVar3 = std::operator>>(piVar3,(string *)&x_value2);
            if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
            local_600 = std::__cxx11::stod(&x_value1,(size_t *)0x0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_558,"x0:1",&local_601);
            pmVar4 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_558);
            *pmVar4 = local_600;
            std::__cxx11::string::~string((string *)&local_558);
            local_600 = std::__cxx11::stod(&x_value2,(size_t *)0x0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_558,"x0:2",&local_601);
            pmVar4 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_558);
            *pmVar4 = local_600;
            std::__cxx11::string::~string((string *)&local_558);
          }
          std::__cxx11::string::~string((string *)&x_value2);
          std::__cxx11::string::~string((string *)&x_value1);
          std::__cxx11::istringstream::~istringstream((istringstream *)&valuestream);
        }
        else {
          local_600 = std::__cxx11::stod(&value,(size_t *)0x0);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)__return_storage_ptr__,&key);
          *pmVar4 = local_600;
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&linestream);
    }
  }
  std::ifstream::~ifstream(&filestream);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<string, double> utils::cfg_parsing(string cfg_filename){
    std::unordered_map<string, double> param_map;
    string line;
    string key;
    string value;
    std::ifstream filestream(cfg_filename);
    if (filestream.is_open()) {
        while (std::getline(filestream, line)) {
            std::replace(line.begin(), line.end(), '=', ' ');
            std::istringstream linestream(line);
            while (linestream >> key >> value){
                if (key == "x0"){
                    std::replace(value.begin(), value.end(), ',', ' ');
                    std::istringstream valuestream(value);
                    string x_value1, x_value2;
                    while (valuestream >> x_value1 >> x_value2){
                        param_map["x0:1"]=stod(x_value1);
                        param_map["x0:2"]=stod(x_value2);
                    }
                }
                else
                    param_map[key]=stod(value);    
    
            } 
                
            
        }
    }
    return param_map;
}